

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::DecoderFeatureIndex::openFromArray(DecoderFeatureIndex *this,char *begin,char *end)

{
  long in_RDX;
  long in_RSI;
  uint *in_RDI;
  bool bVar1;
  size_t expected_file_size;
  size_t file_size;
  uint maxid;
  char *ptr;
  char **in_stack_ffffffffffffffc0;
  
  read_static<unsigned_int>(in_stack_ffffffffffffffc0,in_RDI);
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  bVar1 = *(long *)(in_RDI + 0x58) * 0x10 + 0x24 == in_RDX - in_RSI;
  if (bVar1) {
    *(long *)(in_RDI + 0xdc) = in_RSI;
    *(long *)(in_RDI + 0x5a) = in_RSI + 0x20;
    *(long *)(in_RDI + 0xda) = *(long *)(in_RDI + 0x58) * 8 + in_RSI + 0x20;
  }
  return bVar1;
}

Assistant:

bool DecoderFeatureIndex::openFromArray(const char *begin, const char *end) {
  const char *ptr = begin;
  unsigned int maxid = 0;
  read_static<unsigned int>(&ptr, maxid);
  maxid_ = static_cast<size_t>(maxid);
  const size_t file_size = static_cast<size_t>(end - begin);
  const size_t expected_file_size =
      (sizeof(double) + sizeof(uint64_t)) * maxid_ + sizeof(maxid) + 32;
  if (expected_file_size != file_size) {
    return false;
  }
  charset_ = ptr;
  ptr += 32;
  alpha_ = reinterpret_cast<const double *>(ptr);
  ptr += (sizeof(alpha_[0]) * maxid_);
  key_ = reinterpret_cast<const uint64_t *>(ptr);
  return true;
}